

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

Result __thiscall
testing::
Action<void_(fmt::BasicStringRef<char>,_const_mp::SolutionAdapter<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_&)>
::Perform(Action<void_(fmt::BasicStringRef<char>,_const_mp::SolutionAdapter<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_&)>
          *this,ArgumentTuple *args)

{
  ActionInterface<void_(fmt::BasicStringRef<char>,_const_mp::SolutionAdapter<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_&)>
  *pAVar1;
  allocator<char> local_41;
  string local_40;
  
  pAVar1 = (this->impl_).value_;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,
             "You are using DoDefault() inside a composite action like DoAll() or WithArgs().  This is not supported for technical reasons.  Please instead spell out the default action, or assign the default action to an Action variable and use the variable in various places."
             ,&local_41);
  internal::Assert(pAVar1 != (ActionInterface<void_(fmt::BasicStringRef<char>,_const_mp::SolutionAdapter<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_&)>
                              *)0x0,
                   "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/../thirdparty/gmock/gmock.h"
                   ,0x4c3,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  pAVar1 = (this->impl_).value_;
  (**(code **)(*(long *)pAVar1 + 0x10))(pAVar1,args);
  return;
}

Assistant:

Result Perform(const ArgumentTuple& args) const {
    internal::Assert(
        !IsDoDefault(), __FILE__, __LINE__,
        "You are using DoDefault() inside a composite action like "
        "DoAll() or WithArgs().  This is not supported for technical "
        "reasons.  Please instead spell out the default action, or "
        "assign the default action to an Action variable and use "
        "the variable in various places.");
    return impl_->Perform(args);
  }